

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall mjs::block_statement::print(block_statement *this,wostream *os)

{
  statement *psVar1;
  wostream *pwVar2;
  pointer puVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  
  pwVar2 = std::operator<<(os,"block_statement{");
  pcVar4 = "non-strict";
  if (this->strict_mode_ != false) {
    pcVar4 = "strict";
  }
  pwVar2 = std::operator<<(pwVar2,pcVar4);
  std::operator<<(pwVar2,", {");
  puVar3 = (this->l_).
           super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->l_).
      super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (uVar6 != 0) {
        std::operator<<(os,", ");
        puVar3 = (pointer)((long)&(((this->l_).
                                    super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                  super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                                  ._M_t + lVar5);
      }
      psVar1 = (puVar3->_M_t).
               super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
               super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
               super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
      (**(code **)((long)(psVar1->super_syntax_node)._vptr_syntax_node + 0x10))(psVar1,os);
      uVar6 = uVar6 + 1;
      puVar3 = (this->l_).
               super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 8;
    } while (uVar6 < (ulong)((long)(this->l_).
                                   super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3));
  }
  std::operator<<(os,"}}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "block_statement{" << (strict_mode_ ? "strict" : "non-strict") << ", {";
        for (size_t i = 0; i < l_.size(); ++i) {
            if (i) os << ", ";
            os << *l_[i];
        }
        os << "}}";
    }